

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

void __thiscall Database::ExecuteFile(Database *this,string *filename)

{
  int iVar1;
  char *pcVar2;
  FILE *__stream;
  iterator iVar3;
  iterator iVar4;
  exception *e;
  char *p;
  char *result;
  char buf [4096];
  FILE *fh;
  string query;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  queries;
  string *filename_local;
  Database *this_local;
  
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)((long)&query.field_2 + 8));
  std::__cxx11::string::string((string *)&fh);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  __stream = fopen(pcVar2,"rt");
  while ((pcVar2 = fgets((char *)&result,0x1000,__stream), pcVar2 != (char *)0x0 &&
         (iVar1 = feof(__stream), iVar1 == 0))) {
    for (e = (exception *)&result; *e != (exception)0x0; e = e + 1) {
      if (*e == (exception)0x3b) {
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&query.field_2 + 8),(value_type *)&fh);
        std::__cxx11::string::erase((ulong)&fh,0);
      }
      else {
        std::__cxx11::string::operator+=((string *)&fh,(char)*e);
      }
    }
  }
  fclose(__stream);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&query.field_2 + 8),(value_type *)&fh);
  std::__cxx11::string::erase((ulong)&fh,0);
  iVar3 = std::begin<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&query.field_2 + 8));
  iVar4 = std::end<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&query.field_2 + 8));
  std::
  remove_if<std::_List_iterator<std::__cxx11::string>,Database::ExecuteFile(std::__cxx11::string_const&)::__0>
            (iVar3._M_node,iVar4._M_node);
  iVar3 = std::begin<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&query.field_2 + 8));
  iVar4 = std::end<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&query.field_2 + 8));
  ExecuteQueries<std::_List_iterator<std::__cxx11::string>>
            (this,(_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   )iVar3._M_node,
             (_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )iVar4._M_node);
  std::__cxx11::string::~string((string *)&fh);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)((long)&query.field_2 + 8));
  return;
}

Assistant:

void Database::ExecuteFile(const std::string& filename)
{
	std::list<std::string> queries;
	std::string query;

	FILE* fh = std::fopen(filename.c_str(), "rt");

	try
	{
		while (true)
		{
			char buf[4096];

			const char *result = std::fgets(buf, 4096, fh);

			if (!result || std::feof(fh))
				break;

			for (char* p = buf; *p != '\0'; ++p)
			{
				if (*p == ';')
				{
					queries.push_back(query);
					query.erase();
				}
				else
				{
					query += *p;
				}
			}
		}
	}
	catch (std::exception &e)
	{
		std::fclose(fh);
		throw;
	}

	std::fclose(fh);

	queries.push_back(query);
	query.erase();

	std::remove_if(UTIL_RANGE(queries), [&](const std::string& s) { return util::trim(s).length() == 0; });

	this->ExecuteQueries(UTIL_RANGE(queries));
}